

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_atomic_test.c
# Opt level: O0

char * test_exchange(void)

{
  _Bool _Var1;
  int64_t q;
  int64_t p;
  int64_t val2;
  int64_t val1;
  
  LOCK();
  UNLOCK();
  _Var1 = compare_int64(0xf1062,0xf1062);
  if (_Var1) {
    val1 = 0;
  }
  else {
    val1 = (int64_t)anon_var_dwarf_120;
  }
  return (char *)val1;
}

Assistant:

static char* test_exchange(void)
{
    int64_t val1 = 123124;
    int64_t val2 = 987234;

    int64_t p = val1;
    int64_t q = val2;
    
    hdr_atomic_exchange_64(&p, q);
    mu_assert("Failed hdr_atomic_exchange_64", compare_int64(p, val2));

    return 0;
}